

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall Logger::Impl::formatTime(Impl *this)

{
  tm *__tp;
  LogStream *pLVar1;
  char acStack_68 [8];
  char str_t [26];
  undefined1 local_40 [8];
  timeval tv;
  time_t time;
  char ms [4];
  
  str_t[8] = '\0';
  str_t[9] = '\0';
  str_t[10] = '\0';
  str_t[0xb] = '\0';
  str_t[0xc] = '\0';
  str_t[0xd] = '\0';
  str_t[0xe] = '\0';
  str_t[0xf] = '\0';
  str_t[0x10] = '\0';
  str_t[0x11] = '\0';
  acStack_68[0] = '\0';
  acStack_68[1] = '\0';
  acStack_68[2] = '\0';
  acStack_68[3] = '\0';
  acStack_68[4] = '\0';
  acStack_68[5] = '\0';
  acStack_68[6] = '\0';
  acStack_68[7] = '\0';
  str_t[0] = '\0';
  str_t[1] = '\0';
  str_t[2] = '\0';
  str_t[3] = '\0';
  str_t[4] = '\0';
  str_t[5] = '\0';
  str_t[6] = '\0';
  str_t[7] = '\0';
  gettimeofday((timeval *)local_40,(__timezone_ptr_t)0x0);
  tv.tv_usec = (__suseconds_t)local_40;
  __tp = localtime(&tv.tv_usec);
  strftime(acStack_68,0x1a,"%Y-%m-%d %H:%M:%S",__tp);
  snprintf((char *)((long)&time + 4),4,"%03d",tv.tv_sec / 1000 & 0xffffffff);
  pLVar1 = LogStream::operator<<(&this->stream_,acStack_68);
  pLVar1 = LogStream::operator<<(pLVar1,".");
  pLVar1 = LogStream::operator<<(pLVar1,(char *)((long)&time + 4));
  LogStream::operator<<(pLVar1,"    ");
  return;
}

Assistant:

void Logger::Impl::formatTime() {
    struct timeval tv;
    time_t time;
    char str_t[26] = {0};
    gettimeofday(&tv, NULL);
    time = tv.tv_sec;
    struct tm* p_time = localtime(&time);
    strftime(str_t, 26, "%Y-%m-%d %H:%M:%S", p_time);
    char ms[4];
    snprintf(ms, sizeof(ms), "%03d", static_cast<int>(tv.tv_usec/1000));
    stream_ << str_t << "." << ms << "    ";
}